

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

bool __thiscall
helics::TimeDependencies::checkIfReadyForTimeGrant
          (TimeDependencies *this,bool iterating,Time desiredGrantTime,GrantDelayMode delayMode)

{
  TimeState TVar1;
  DependencyInfo *pDVar2;
  bool bVar3;
  DependencyInfo *dep;
  pointer pDVar4;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it_00;
  long lVar5;
  undefined7 in_register_00000031;
  bool bVar6;
  int iVar7;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var8;
  _Iter_negate<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_TimeDependencies_cpp:560:28)>
  local_40;
  
  if ((int)CONCAT71(in_register_00000031,iterating) == 0) {
    if (delayMode == WAITING) {
      pDVar4 = (this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        bVar3 = pDVar4 == (this->dependencies).
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar3) {
          return true;
        }
        bVar6 = false;
        if (((pDVar4->dependency == true) &&
            (lVar5 = (pDVar4->super_TimeData).next.internalTimeCode, lVar5 != 0x7fffffffffffffff))
           && (pDVar4->connection != SELF)) {
          bVar6 = lVar5 <= desiredGrantTime.internalTimeCode;
        }
        if (bVar6) break;
        pDVar4 = pDVar4 + 1;
      }
    }
    else {
      if (delayMode == INTERRUPTED) {
        pDVar4 = (this->dependencies).
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar3 = pDVar4 == (this->dependencies).
                            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar3) {
            return true;
          }
          iVar7 = 6;
          if (((pDVar4->dependency == true) &&
              (lVar5 = (pDVar4->super_TimeData).next.internalTimeCode, lVar5 != 0x7fffffffffffffff))
             && (pDVar4->connection != SELF)) {
            if (lVar5 < desiredGrantTime.internalTimeCode) {
LAB_0035f4dd:
              iVar7 = 1;
            }
            else {
              iVar7 = 0;
              if (lVar5 == desiredGrantTime.internalTimeCode) {
                TVar1 = (pDVar4->super_TimeData).mTimeState;
                if (TVar1 == time_granted) goto LAB_0035f4dd;
                if (((TVar1 != time_requested) || (iVar7 = 1, pDVar4->nonGranting == false)) &&
                   (iVar7 = 6, (pDVar4->super_TimeData).interrupted == false)) {
                  bVar6 = (pDVar4->super_TimeData).delayedTiming;
                  iVar7 = (uint)bVar6 + (uint)bVar6 * 4 + 1;
                }
              }
            }
          }
          if ((iVar7 != 6) && (iVar7 != 0)) goto LAB_0035f58f;
          pDVar4 = pDVar4 + 1;
        } while( true );
      }
      if (delayMode != NONE) {
        return true;
      }
      pDVar4 = (this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        bVar3 = pDVar4 == (this->dependencies).
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar3) {
          return true;
        }
        bVar6 = false;
        if (((pDVar4->dependency == true) &&
            (lVar5 = (pDVar4->super_TimeData).next.internalTimeCode, lVar5 != 0x7fffffffffffffff))
           && (pDVar4->connection != SELF)) {
          bVar6 = true;
          if ((desiredGrantTime.internalTimeCode <= lVar5) &&
             ((lVar5 != desiredGrantTime.internalTimeCode ||
              ((TVar1 = (pDVar4->super_TimeData).mTimeState, TVar1 != time_granted &&
               ((TVar1 != time_requested || (pDVar4->nonGranting == false)))))))) {
            bVar6 = false;
          }
        }
        if (bVar6) break;
        pDVar4 = pDVar4 + 1;
      }
    }
LAB_0035f58f:
    if (bVar3) {
      return true;
    }
    return false;
  }
  __it._M_current =
       (this->dependencies).
       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)pDVar2 - (long)__it._M_current >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  __it_00._M_current = __it._M_current;
  local_40._M_pred.desiredGrantTime.internalTimeCode = desiredGrantTime.internalTimeCode;
  local_40._M_pred.delayMode = delayMode;
  if (0 < lVar5) {
    __it_00._M_current = __it._M_current + lVar5 * 4;
    lVar5 = lVar5 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()(&local_40,__it);
      _Var8._M_current = __it._M_current;
      if (bVar3) goto LAB_0035f3fd;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()(&local_40,__it._M_current + 1);
      _Var8._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0035f3fd;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()(&local_40,__it._M_current + 2);
      _Var8._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0035f3fd;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
              ::operator()(&local_40,__it._M_current + 3);
      _Var8._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0035f3fd;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = ((long)pDVar2 - (long)__it_00._M_current >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var8._M_current = pDVar2;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
                  ::operator()(&local_40,__it_00), _Var8._M_current = __it_00._M_current, bVar3))
      goto LAB_0035f3fd;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
            ::operator()(&local_40,__it_00);
    _Var8._M_current = __it_00._M_current;
    if (bVar3) goto LAB_0035f3fd;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
          ::operator()(&local_40,__it_00);
  _Var8._M_current = __it_00._M_current;
  if (!bVar3) {
    _Var8._M_current = pDVar2;
  }
LAB_0035f3fd:
  return _Var8._M_current == pDVar2;
}

Assistant:

bool TimeDependencies::checkIfReadyForTimeGrant(bool iterating,
                                                Time desiredGrantTime,
                                                GrantDelayMode delayMode) const
{
    if (iterating) {
        return std::all_of(dependencies.begin(),
                           dependencies.end(),
                           [desiredGrantTime, delayMode](const auto& dep) {
                               return iteratingTimeGrantCheck(dep, desiredGrantTime, delayMode);
                           });
    }
    switch (delayMode) {
        case GrantDelayMode::NONE:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }
                }
            }
            break;
        case GrantDelayMode::INTERRUPTED:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }

                    if (dep.interrupted || dep.delayedTiming) {
                        continue;
                    }
                    return false;
                }
            }
            break;
        case GrantDelayMode::WAITING:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next <= desiredGrantTime) {
                    return false;
                }
            }
            break;
    }

    return true;
}